

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O0

void * r2i_certpol(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,char *value)

{
  char *__s1;
  int iVar1;
  stack_st_CONF_VALUE *sk;
  CONF_VALUE *pCVar2;
  stack_st_CONF_VALUE *polstrs;
  ASN1_OBJECT *a;
  size_t sVar3;
  ASN1_OBJECT *pobj;
  stack_st_CONF_VALUE *polsect;
  char *pstr;
  POLICYINFO *pol;
  CONF_VALUE *cnf;
  size_t i;
  int ia5org;
  stack_st_CONF_VALUE *vals;
  stack_st_POLICYINFO *pols;
  char *value_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  method_local = (X509V3_EXT_METHOD *)sk_POLICYINFO_new_null();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    sk = (stack_st_CONF_VALUE *)X509V3_parse_list(value);
    if (sk == (stack_st_CONF_VALUE *)0x0) {
      ERR_put_error(0x14,0,0x14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                    ,0x7c);
LAB_007676f2:
      sk_CONF_VALUE_pop_free(sk,X509V3_conf_free);
      sk_POLICYINFO_pop_free((stack_st_POLICYINFO *)method_local,POLICYINFO_free);
      method_local = (X509V3_EXT_METHOD *)0x0;
    }
    else {
      i._4_4_ = 0;
      for (cnf = (CONF_VALUE *)0x0; pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num(sk), cnf < pCVar2;
          cnf = (CONF_VALUE *)((long)&cnf->section + 1)) {
        pCVar2 = sk_CONF_VALUE_value(sk,(size_t)cnf);
        if ((pCVar2->value != (char *)0x0) || (pCVar2->name == (char *)0x0)) {
          ERR_put_error(0x14,0,0x83,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                        ,0x83);
          ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                             pCVar2->value);
          goto LAB_007676f2;
        }
        __s1 = pCVar2->name;
        iVar1 = strcmp(__s1,"ia5org");
        if (iVar1 == 0) {
          i._4_4_ = 1;
        }
        else {
          if (*__s1 == '@') {
            polstrs = (stack_st_CONF_VALUE *)X509V3_get_section((X509V3_CTX *)ctx,__s1 + 1);
            if (polstrs == (stack_st_CONF_VALUE *)0x0) {
              ERR_put_error(0x14,0,0x86,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                            ,0x8f);
              ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                                 pCVar2->value);
              goto LAB_007676f2;
            }
            pstr = (char *)policy_section(ctx,polstrs,i._4_4_);
            if ((POLICYINFO *)pstr == (POLICYINFO *)0x0) goto LAB_007676f2;
          }
          else {
            a = OBJ_txt2obj(pCVar2->name,0);
            if (a == (ASN1_OBJECT *)0x0) {
              ERR_put_error(0x14,0,0x81,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                            ,0x9b);
              ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                                 pCVar2->value);
              goto LAB_007676f2;
            }
            pstr = (char *)POLICYINFO_new();
            if ((POLICYINFO *)pstr == (POLICYINFO *)0x0) {
              ASN1_OBJECT_free(a);
              goto LAB_007676f2;
            }
            ((POLICYINFO *)pstr)->policyid = a;
          }
          sVar3 = sk_POLICYINFO_push((stack_st_POLICYINFO *)method_local,(POLICYINFO *)pstr);
          if (sVar3 == 0) {
            POLICYINFO_free((POLICYINFO *)pstr);
            goto LAB_007676f2;
          }
        }
      }
      sk_CONF_VALUE_pop_free(sk,X509V3_conf_free);
    }
  }
  return method_local;
}

Assistant:

static void *r2i_certpol(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                         const char *value) {
  STACK_OF(POLICYINFO) *pols = sk_POLICYINFO_new_null();
  if (pols == NULL) {
    return NULL;
  }
  STACK_OF(CONF_VALUE) *vals = X509V3_parse_list(value);

  {
    if (vals == NULL) {
      OPENSSL_PUT_ERROR(X509V3, ERR_R_X509V3_LIB);
      goto err;
    }
    int ia5org = 0;
    for (size_t i = 0; i < sk_CONF_VALUE_num(vals); i++) {
      const CONF_VALUE *cnf = sk_CONF_VALUE_value(vals, i);
      if (cnf->value || !cnf->name) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_POLICY_IDENTIFIER);
        X509V3_conf_err(cnf);
        goto err;
      }
      POLICYINFO *pol;
      const char *pstr = cnf->name;
      if (!strcmp(pstr, "ia5org")) {
        ia5org = 1;
        continue;
      } else if (*pstr == '@') {
        const STACK_OF(CONF_VALUE) *polsect = X509V3_get_section(ctx, pstr + 1);
        if (!polsect) {
          OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SECTION);

          X509V3_conf_err(cnf);
          goto err;
        }
        pol = policy_section(ctx, polsect, ia5org);
        if (!pol) {
          goto err;
        }
      } else {
        ASN1_OBJECT *pobj = OBJ_txt2obj(cnf->name, 0);
        if (pobj == NULL) {
          OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
          X509V3_conf_err(cnf);
          goto err;
        }
        pol = POLICYINFO_new();
        if (pol == NULL) {
          ASN1_OBJECT_free(pobj);
          goto err;
        }
        pol->policyid = pobj;
      }
      if (!sk_POLICYINFO_push(pols, pol)) {
        POLICYINFO_free(pol);
        goto err;
      }
    }
    sk_CONF_VALUE_pop_free(vals, X509V3_conf_free);
    return pols;
  }

err:
  sk_CONF_VALUE_pop_free(vals, X509V3_conf_free);
  sk_POLICYINFO_pop_free(pols, POLICYINFO_free);
  return NULL;
}